

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Aig_Obj_t *
createArenaViolation
          (Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pWindowBegins,Aig_Obj_t *pWithinWindow,
          Vec_Ptr_t *vMasterBarriers,Vec_Ptr_t *vBarrierLo,Vec_Ptr_t *vBarrierLiDriver,
          Vec_Ptr_t *vMonotoneDisjunctionNodes)

{
  Vec_Ptr_t *p;
  void *Entry;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  int iVar3;
  int iVar4;
  Aig_Obj_t *local_60;
  
  if (vBarrierLiDriver == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierLiDriver != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb6,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes == (Vec_Ptr_t *)0x0) {
    __assert_fail("vMonotoneDisjunctionNodes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xb7,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  local_60 = pAigNew->pConst1;
  p = collectBarrierDisjunctions(pAigOld,pAigNew,vMasterBarriers);
  if (p == (Vec_Ptr_t *)0x0) {
    __assert_fail("vBarrierSignals != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xbc,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (vMonotoneDisjunctionNodes->nSize == 0) {
    local_60 = (Aig_Obj_t *)((ulong)local_60 ^ 1);
    iVar4 = 0;
    iVar3 = p->nSize;
    if (p->nSize < 1) {
      iVar3 = iVar4;
    }
    for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
      Entry = Vec_PtrEntry(p,iVar4);
      Vec_PtrPush(vMonotoneDisjunctionNodes,Entry);
    }
    if (vMonotoneDisjunctionNodes->nSize == vMasterBarriers->nSize) {
      for (iVar4 = 0; iVar3 != iVar4; iVar4 = iVar4 + 1) {
        pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar4);
        pAVar2 = Aig_And(pAigNew,pAVar1,pWindowBegins);
        p1 = (Aig_Obj_t *)Vec_PtrEntry(vBarrierLo,iVar4);
        pAVar2 = Aig_Or(pAigNew,pAVar2,p1);
        Vec_PtrPush(vBarrierLiDriver,pAVar2);
        pAVar1 = Aig_Xor(pAigNew,pAVar1,p1);
        pAVar1 = Aig_And(pAigNew,pAVar1,pWithinWindow);
        local_60 = Aig_Or(pAigNew,pAVar1,local_60);
      }
      Vec_PtrFree(p);
      return local_60;
    }
    __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                  ,0xc1,
                  "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  __assert_fail("Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                ,0xbe,
                "Aig_Obj_t *createArenaViolation(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Obj_t *createArenaViolation(
		Aig_Man_t *pAigOld,
		Aig_Man_t *pAigNew, 
		Aig_Obj_t *pWindowBegins, 
		Aig_Obj_t *pWithinWindow, 
		Vec_Ptr_t *vMasterBarriers, 
		Vec_Ptr_t *vBarrierLo,
		Vec_Ptr_t *vBarrierLiDriver,
		Vec_Ptr_t *vMonotoneDisjunctionNodes
		)
{
	Aig_Obj_t *pWindowBeginsLocal = pWindowBegins;
	Aig_Obj_t *pWithinWindowLocal = pWithinWindow;
	int i;
	Aig_Obj_t *pObj, *pObjAnd1, *pObjOr1, *pObjAnd2, *pObjBarrierLo, *pObjBarrierSwitch, *pObjArenaViolation;
	Vec_Ptr_t *vBarrierSignals;

	assert( vBarrierLiDriver != NULL );
	assert( vMonotoneDisjunctionNodes != NULL );

	pObjArenaViolation = Aig_Not(Aig_ManConst1( pAigNew ));

	vBarrierSignals = collectBarrierDisjunctions(pAigOld, pAigNew, vMasterBarriers);
	assert( vBarrierSignals != NULL );

	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == 0 );
	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
		Vec_PtrPush( vMonotoneDisjunctionNodes, pObj );
	assert( Vec_PtrSize( vMonotoneDisjunctionNodes ) == Vec_PtrSize( vMasterBarriers ) );

	Vec_PtrForEachEntry( Aig_Obj_t *, vBarrierSignals, pObj, i )
	{
		//pObjNew = driverToPoNew( pAigOld, pObj );
		pObjAnd1 = Aig_And(pAigNew, pObj, pWindowBeginsLocal);
		pObjBarrierLo = (Aig_Obj_t *)Vec_PtrEntry( vBarrierLo, i );
		pObjOr1 = Aig_Or(pAigNew, pObjAnd1, pObjBarrierLo);
		Vec_PtrPush( vBarrierLiDriver, pObjOr1 );

		pObjBarrierSwitch = Aig_Xor( pAigNew, pObj, pObjBarrierLo );
		pObjAnd2 = Aig_And( pAigNew, pObjBarrierSwitch, pWithinWindowLocal );
		pObjArenaViolation = Aig_Or( pAigNew, pObjAnd2, pObjArenaViolation );
	}

	Vec_PtrFree(vBarrierSignals);
	return pObjArenaViolation;
}